

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_kernel_c.h
# Opt level: O3

void __thiscall
dlib::
map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::binary_search_tree_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
::add(map_kernel_c<dlib::map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::binary_search_tree_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
      *this,domain *d,range *r)

{
  binary_search_tree_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  node **t;
  short *psVar1;
  unsigned_long *puVar2;
  bool bVar3;
  int *piVar4;
  ostream *poVar5;
  fatal_error *this_01;
  char *pcVar6;
  ostringstream dlib_o_out;
  string sStack_1c8;
  undefined1 local_1a8 [376];
  
  this_00 = &(this->
             super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::binary_search_tree_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
             ).bst;
  t = &(this->
       super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::binary_search_tree_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
       ).bst.tree_root;
  piVar4 = binary_search_tree_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::return_reference(this_00,(this->
                                      super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::binary_search_tree_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                                      ).bst.tree_root,d);
  if ((d != (domain *)r) && (piVar4 == (int *)0x0)) {
    bVar3 = binary_search_tree_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::add_to_tree(this_00,t,d,r);
    psVar1 = &(this->
              super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::binary_search_tree_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
              ).bst.tree_height;
    *psVar1 = *psVar1 + (ushort)bVar3;
    puVar2 = &(this->
              super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::binary_search_tree_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
              ).bst.tree_size;
    *puVar2 = *puVar2 + 1;
    (*(this->
      super_map_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::binary_search_tree_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
      ).bst.
      super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
      ._vptr_enumerable[3])(this_00);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n\nError detected at line ",0x19);
  poVar5 = (ostream *)std::ostream::operator<<(local_1a8,0x73);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/gui_widgets/../gui_core/../threads/../map/map_kernel_c.h"
             ,0x85);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "void dlib::map_kernel_c<dlib::map_kernel_1<std::basic_string<char>, int, dlib::binary_search_tree_kernel_1<std::basic_string<char>, int, dlib::memory_manager_stateless_kernel_1<char>>>>::add(domain &, range &) [map_base = dlib::map_kernel_1<std::basic_string<char>, int, dlib::binary_search_tree_kernel_1<std::basic_string<char>, int, dlib::memory_manager_stateless_kernel_1<char>>>]"
             ,0x17f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "(!this->is_in_domain(d)) && (static_cast<void*>(&d) != static_cast<void*>(&r))",0x4e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
  *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) =
       *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\tvoid map::add",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n\tdomain element being added must not already be in the map",
             0x3b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n\tand d and r must not be the same variable",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n\tis_in_domain(d): ",0x13);
  piVar4 = binary_search_tree_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::return_reference(this_00,*t,d);
  pcVar6 = "true";
  if (piVar4 == (int *)0x0) {
    pcVar6 = "false";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,pcVar6,(ulong)(piVar4 == (int *)0x0) | 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n\tthis: ",8);
  poVar5 = std::ostream::_M_insert<void_const*>(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n\t&d:   ",8);
  poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n\t&r:   ",8);
  poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  this_01 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_01,EBROKEN_ASSERT,&sStack_1c8);
  __cxa_throw(this_01,&fatal_error::typeinfo,error::~error);
}

Assistant:

void map_kernel_c<map_base>::
    add (
        domain& d,
        range& r
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT( (!this->is_in_domain(d)) &&
                (static_cast<void*>(&d) != static_cast<void*>(&r)),
            "\tvoid map::add"
            << "\n\tdomain element being added must not already be in the map"
            << "\n\tand d and r must not be the same variable"
            << "\n\tis_in_domain(d): " << (this->is_in_domain(d) ? "true" : "false")
            << "\n\tthis: " << this
            << "\n\t&d:   " << static_cast<void*>(&d)
            << "\n\t&r:   " << static_cast<void*>(&r)
            );

        // call the real function
        map_base::add(d,r);
    }